

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Property_Set(FT_Library library,FT_String *module_name,FT_String *property_name,
                        void *value)

{
  FT_Error FVar1;
  
  FVar1 = ft_property_do(library,module_name,property_name,value,'\x01','\0');
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Property_Set( FT_Library        library,
                   const FT_String*  module_name,
                   const FT_String*  property_name,
                   const void*       value )
  {
    return ft_property_do( library,
                           module_name,
                           property_name,
                           (void*)value,
                           TRUE,
                           FALSE );
  }